

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanocat.c
# Opt level: O0

int nn_create_socket(nn_options_t *options)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  int local_1c;
  int local_18;
  int millis;
  int rc;
  int sock;
  nn_options_t *options_local;
  
  _rc = options;
  millis = nn_socket(1,options->socket_type);
  nn_assert_errno((uint)(-1 < millis),"Can\'t create socket");
  if (0.0 <= _rc->send_timeout) {
    local_1c = (int)(_rc->send_timeout * 1000.0);
    local_18 = nn_setsockopt(millis,0,4,&local_1c,4);
    nn_assert_errno((uint)(local_18 == 0),"Can\'t set send timeout");
  }
  if (0.0 <= _rc->recv_timeout) {
    nn_set_recv_timeout(millis,(int)_rc->recv_timeout * 1000);
  }
  iVar2 = millis;
  if (_rc->socket_name != (char *)0x0) {
    pcVar1 = _rc->socket_name;
    sVar3 = strlen(_rc->socket_name);
    local_18 = nn_setsockopt(iVar2,0,0xf,pcVar1,sVar3);
    nn_assert_errno((uint)(local_18 == 0),"Can\'t set socket name");
  }
  if (_rc->socket_type == 0x21) {
    nn_sub_init(_rc,millis);
  }
  return millis;
}

Assistant:

int nn_create_socket (nn_options_t *options)
{
    int sock;
    int rc;
    int millis;

    sock = nn_socket (AF_SP, options->socket_type);
    nn_assert_errno (sock >= 0, "Can't create socket");

    /* Generic initialization */
    if (options->send_timeout >= 0) {
        millis = (int)(options->send_timeout * 1000);
        rc = nn_setsockopt (sock, NN_SOL_SOCKET, NN_SNDTIMEO,
                           &millis, sizeof (millis));
        nn_assert_errno (rc == 0, "Can't set send timeout");
    }
    if (options->recv_timeout >= 0) {
        nn_set_recv_timeout (sock, (int) options->recv_timeout * 1000);
    }
    if (options->socket_name) {
        rc = nn_setsockopt (sock, NN_SOL_SOCKET, NN_SOCKET_NAME,
                           options->socket_name, strlen(options->socket_name));
        nn_assert_errno (rc == 0, "Can't set socket name");
    }

    /* Specific initialization */
    switch (options->socket_type) {
    case NN_SUB:
        nn_sub_init (options, sock);
        break;
    }

    return sock;
}